

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

int __thiscall QByteArray::remove(QByteArray *this,char *__filename)

{
  char *pcVar1;
  Data *pDVar2;
  qsizetype qVar3;
  long in_RDX;
  char *b;
  long n;
  long in_FS_OFFSET;
  initializer_list<QtPrivate::QPodArrayOps<char>::Span> ranges;
  QArrayDataPointer<char> local_68;
  Span local_48;
  char *local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (long)__filename && 0 < in_RDX) {
    pcVar1 = (char *)(this->d).size;
    if (__filename <= pcVar1 && (long)pcVar1 - (long)__filename != 0) {
      n = (long)pcVar1 - (long)__filename;
      if (__filename + in_RDX <= pcVar1) {
        n = in_RDX;
      }
      b = __filename + (long)(this->d).ptr;
      pDVar2 = (this->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
        local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray((QByteArray *)&local_68,(long)pcVar1 - n,(Initialization)in_RDX);
        local_48.begin = (this->d).ptr;
        local_38 = b + n;
        local_30 = local_48.begin + (this->d).size;
        ranges._M_len = 2;
        ranges._M_array = &local_48;
        local_48.end = b;
        QtPrivate::QPodArrayOps<char>::copyRanges((QPodArrayOps<char> *)&local_68,ranges);
        pDVar2 = (this->d).d;
        pcVar1 = (this->d).ptr;
        (this->d).d = local_68.d;
        (this->d).ptr = local_68.ptr;
        qVar3 = (this->d).size;
        (this->d).size = local_68.size;
        local_68.d = pDVar2;
        local_68.ptr = pcVar1;
        local_68.size = qVar3;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      }
      else {
        QtPrivate::QPodArrayOps<char>::erase((QPodArrayOps<char> *)this,b,n);
        (this->d).ptr[(this->d).size] = '\0';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::remove(qsizetype pos, qsizetype len)
{
    if (len <= 0  || pos < 0 || size_t(pos) >= size_t(size()))
        return *this;
    if (pos + len > d->size)
        len = d->size - pos;

    const auto toRemove_start = d.begin() + pos;
    if (!d->isShared()) {
        d->erase(toRemove_start, len);
        d.data()[d.size] = '\0';
    } else {
        QByteArray copy{size() - len, Qt::Uninitialized};
        copy.d->copyRanges({{d.begin(), toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}